

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::AssertionHandler::handleExpr<type_safe::deferred_construction<int>const&>
          (AssertionHandler *this,ExprLhs<const_type_safe::deferred_construction<int>_&> *expr)

{
  ITransientExpression local_20;
  deferred_construction<int> *local_10;
  
  local_10 = expr->m_lhs;
  local_20.m_result = local_10->initialized_;
  local_20.m_isBinaryExpression = false;
  local_20._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0022f888;
  handleExpr(this,&local_20);
  ITransientExpression::~ITransientExpression(&local_20);
  return;
}

Assistant:

auto makeUnaryExpr() const -> UnaryExpr<LhsT> {
            return UnaryExpr<LhsT>{ m_lhs };
        }